

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O1

void __thiscall SFFile::SFFile(SFFile *this,FString *filename)

{
  FString FStack_18;
  
  FString::AttachToOther(&FStack_18,filename);
  Timidity::FontFile::FontFile(&this->super_FontFile,&FStack_18);
  FString::~FString(&FStack_18);
  (this->super_FontFile)._vptr_FontFile = (_func_int **)&PTR__SFFile_00840138;
  this->Presets = (SFPreset *)0x0;
  this->PresetBags = (SFBag *)0x0;
  this->PresetGenerators = (SFGenList *)0x0;
  this->Instruments = (SFInst *)0x0;
  this->InstrBags = (SFBag *)0x0;
  this->InstrGenerators = (SFGenList *)0x0;
  this->Samples = (SFSample *)0x0;
  (this->Percussion).Array = (SFPerc *)0x0;
  (this->Percussion).Most = 0;
  (this->Percussion).Count = 0;
  this->MinorVersion = 0;
  this->SampleDataOffset = 0;
  this->SampleDataLSBOffset = 0;
  this->SizeSampleData = 0;
  this->SizeSampleDataLSB = 0;
  this->NumPresets = 0;
  this->NumPresetBags = 0;
  this->NumPresetGenerators = 0;
  this->NumInstruments = 0;
  this->NumInstrBags = 0;
  this->NumInstrGenerators = 0;
  this->NumSamples = 0;
  return;
}

Assistant:

SFFile::SFFile(FString filename)
: FontFile(filename)
{
	Presets = NULL;
	PresetBags = NULL;
	PresetGenerators = NULL;
	Instruments = NULL;
	InstrBags = NULL;
	InstrGenerators = NULL;
	Samples = NULL;
	MinorVersion = 0;
	SampleDataOffset = 0;
	SampleDataLSBOffset = 0;
	SizeSampleData = 0;
	SizeSampleDataLSB = 0;
	NumPresets = 0;
	NumPresetBags = 0;
	NumPresetGenerators = 0;
	NumInstruments = 0;
	NumInstrBags = 0;
	NumInstrGenerators = 0;
	NumSamples = 0;
}